

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  task_data *__s;
  example *peVar1;
  iterator iVar2;
  iterator this;
  iterator lp;
  undefined8 *in_RDX;
  search *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newtriples;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newpairs;
  char *triple [12];
  char *pair [19];
  size_t i;
  option_group_definition new_options;
  task_data *data;
  vw *all;
  string *in_stack_fffffffffffff6a8;
  typed_option<bool> *in_stack_fffffffffffff6b0;
  string *in_stack_fffffffffffff6b8;
  typed_option<unsigned_long> *in_stack_fffffffffffff6c0;
  allocator_type *in_stack_fffffffffffff6d8;
  char **in_stack_fffffffffffff6e0;
  char **in_stack_fffffffffffff6e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff6f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  typed_option<bool> *in_stack_fffffffffffff6f8;
  option_group_definition *in_stack_fffffffffffff700;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  const_iterator __position;
  __0 local_7d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_798;
  uint32_t in_stack_fffffffffffff87c;
  search *in_stack_fffffffffffff880;
  size_t in_stack_fffffffffffff898;
  v_array<unsigned_int> *in_stack_fffffffffffff8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8 [5];
  char local_641;
  ulong local_640;
  undefined1 local_632;
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [32];
  typed_option<bool> local_5e8;
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [32];
  typed_option<bool> local_4f8;
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [32];
  typed_option<bool> local_408;
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [32];
  typed_option<unsigned_int> local_318;
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [32];
  typed_option<unsigned_int> local_228;
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  typed_option<unsigned_long> local_138;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  task_data *local_28;
  vw *local_20;
  undefined8 *local_18;
  search *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = Search::search::get_vw_pointer_unsafe(in_RDI);
  __s = (task_data *)operator_new(0x2c8);
  memset(__s,0,0x2c8);
  local_28 = __s;
  v_array<unsigned_int>::resize(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  local_28->ex = (example *)0x0;
  Search::search::set_task_data<task_data>(local_8,local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Dependency Parser Options",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"root_label",&local_159);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff6b8,(unsigned_long *)in_stack_fffffffffffff6b0);
  VW::config::typed_option<unsigned_long>::keep(&local_138,true);
  VW::config::typed_option<unsigned_long>::default_value
            (in_stack_fffffffffffff6c0,(unsigned_long)in_stack_fffffffffffff6b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_180,"Ensure that there is only one root in each sentence",&local_181);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffff700,(typed_option<unsigned_long> *)in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff6b0);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"num_label",&local_249);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff6b8,(uint *)in_stack_fffffffffffff6b0)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_228,true);
  VW::config::typed_option<unsigned_int>::default_value
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff6c0,
             (uint)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"Number of arc labels",&local_271);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_fffffffffffff700,(typed_option<unsigned_int> *)in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff6b0);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"transition_system",&local_339);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff6b8,(uint *)in_stack_fffffffffffff6b0)
  ;
  VW::config::typed_option<unsigned_int>::keep(&local_318,true);
  VW::config::typed_option<unsigned_int>::default_value
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff6c0,
             (uint)((ulong)in_stack_fffffffffffff6b8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"1: arc-hybrid 2: arc-eager",&local_361);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            (in_stack_fffffffffffff700,(typed_option<unsigned_int> *)in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff6b0);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"one_learner",&local_429);
  VW::config::make_option<bool>(in_stack_fffffffffffff6b8,(bool *)in_stack_fffffffffffff6b0);
  VW::config::typed_option<bool>::keep(&local_408,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_450,"Using one learner instead of three learners for labeled parser",&local_451);
  VW::config::typed_option<bool>::help(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff6b0);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"cost_to_go",&local_519);
  VW::config::make_option<bool>(in_stack_fffffffffffff6b8,(bool *)in_stack_fffffffffffff6b0);
  VW::config::typed_option<bool>::keep(&local_4f8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_540,
             "Estimating cost-to-go matrix based on dynamic oracle rathan than rolling-out",
             &local_541);
  VW::config::typed_option<bool>::help(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff6b0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"old_style_labels",&local_609);
  VW::config::make_option<bool>(in_stack_fffffffffffff6b8,(bool *)in_stack_fffffffffffff6b0);
  VW::config::typed_option<bool>::keep(&local_5e8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"Use old hack of label information",&local_631);
  VW::config::typed_option<bool>::help(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff700,in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  VW::config::typed_option<bool>::~typed_option(in_stack_fffffffffffff6b0);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  (**(code **)*local_18)(local_18,local_60);
  peVar1 = VW::alloc_examples((size_t)in_stack_fffffffffffff6b8,(size_t)in_stack_fffffffffffff6b0);
  local_28->ex = peVar1;
  local_632 = 100;
  v_array<unsigned_char>::push_back
            ((v_array<unsigned_char> *)in_stack_fffffffffffff6b0,(uchar *)in_stack_fffffffffffff6a8)
  ;
  for (local_640 = 1; local_640 < 0xe; local_640 = local_640 + 1) {
    local_641 = (char)local_640 + 'A';
    v_array<unsigned_char>::push_back
              ((v_array<unsigned_char> *)in_stack_fffffffffffff6b0,
               (uchar *)in_stack_fffffffffffff6a8);
  }
  v_array<unsigned_char>::push_back
            ((v_array<unsigned_char> *)in_stack_fffffffffffff6b0,(uchar *)in_stack_fffffffffffff6a8)
  ;
  if ((local_28->one_learner & 1U) == 0) {
    Search::search::set_num_learners(local_8,3);
  }
  else {
    Search::search::set_num_learners(local_8,1);
  }
  memcpy(local_6e8,&PTR_anon_var_dwarf_6a786_0048b150,0x98);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x15a4a8);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
             in_stack_fffffffffffff6d8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x15a4d3);
  __first._M_current = local_6e8;
  __position._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0xfffffffffffff87f
  ;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x15a4f2);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e0,
             in_stack_fffffffffffff6d8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x15a520);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffff6c0,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffff6b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffff6c0,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffff6b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x15a56c);
  this_00 = &local_20->interactions;
  iVar2 = std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff6a8);
  local_798 = iVar2._M_current;
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff6b0,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff6a8);
  local_7a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff6a8);
  local_7a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff6a8);
  local_7b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                        (this_00,__position,__first,iVar2._M_current);
  local_7c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff6a8);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff6b0,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff6a8);
  this = std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff6a8);
  local_7c8 = this._M_current;
  lp = std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff6a8);
  local_7d0 = lp._M_current;
  iVar2 = std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    (this_00,__position,__first,iVar2._M_current);
  local_7d8 = iVar2._M_current;
  if ((local_28->cost_to_go & 1U) == 0) {
    Search::search::set_options(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  }
  else {
    Search::search::set_options(in_stack_fffffffffffff880,in_stack_fffffffffffff87c);
  }
  initialize(Search::search&,unsigned_long&,VW::config::options_i&)::$_0::
  operator_cast_to_function_pointer(&local_7d9);
  Search::search::set_label_parser
            ((search *)this._M_current,(label_parser *)lp._M_current,
             (_func_bool_polylabel_ptr *)iVar2._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this._M_current);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this._M_current);
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)iVar2._M_current);
  return;
}

Assistant:

void initialize(Search::search &sch, size_t & /*num_actions*/, options_i &options)
{
  vw &all = sch.get_vw_pointer_unsafe();
  task_data *data = new task_data();
  data->action_loss.resize(5);
  data->ex = NULL;
  sch.set_task_data<task_data>(data);

  option_group_definition new_options("Dependency Parser Options");
  new_options.add(make_option("root_label", data->root_label)
                      .keep()
                      .default_value(8)
                      .help("Ensure that there is only one root in each sentence"));
  new_options.add(make_option("num_label", data->num_label).keep().default_value(12).help("Number of arc labels"));
  new_options.add(make_option("transition_system", data->transition_system)
                      .keep()
                      .default_value(1)
                      .help("1: arc-hybrid 2: arc-eager"));
  new_options.add(make_option("one_learner", data->one_learner)
                      .keep()
                      .help("Using one learner instead of three learners for labeled parser"));
  new_options.add(make_option("cost_to_go", data->cost_to_go)
                      .keep()
                      .help("Estimating cost-to-go matrix based on dynamic oracle rathan than rolling-out"));
  new_options.add(
      make_option("old_style_labels", data->old_style_labels).keep().help("Use old hack of label information"));
  options.add_and_parse(new_options);

  data->ex = VW::alloc_examples(sizeof(polylabel), 1);
  data->ex->indices.push_back(val_namespace);
  for (size_t i = 1; i < 14; i++) data->ex->indices.push_back((unsigned char)i + 'A');
  data->ex->indices.push_back(constant_namespace);

  if (data->one_learner)
    sch.set_num_learners(1);
  else
    sch.set_num_learners(3);

  const char *pair[] = {
      "BC", "BE", "BB", "CC", "DD", "EE", "FF", "GG", "EF", "BH", "BJ", "EL", "dB", "dC", "dD", "dE", "dF", "dG", "dd"};
  const char *triple[] = {"EFG", "BEF", "BCE", "BCD", "BEL", "ELM", "BHI", "BCC", "BEJ", "BEH", "BJK", "BEN"};
  vector<string> newpairs(pair, pair + 19);
  vector<string> newtriples(triple, triple + 12);
  all.pairs.swap(newpairs);
  all.triples.swap(newtriples);

  all.interactions.clear();
  all.interactions.insert(std::end(all.interactions), std::begin(all.pairs), std::end(all.pairs));
  all.interactions.insert(std::end(all.interactions), std::begin(all.triples), std::end(all.triples));
  if (data->cost_to_go)
    sch.set_options(AUTO_CONDITION_FEATURES | NO_CACHING | ACTION_COSTS);
  else
    sch.set_options(AUTO_CONDITION_FEATURES | NO_CACHING);

  sch.set_label_parser(COST_SENSITIVE::cs_label, [](polylabel &l) -> bool { return l.cs.costs.size() == 0; });
}